

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_third_step1.cpp
# Opt level: O1

void __thiscall
ruckig::PositionThirdOrderStep1::time_acc0_acc1
          (PositionThirdOrderStep1 *this,ProfileIter *profile,double vMax,double vMin,double aMax,
          double aMin,double jMax,bool return_after_found)

{
  double dVar1;
  Profile *pPVar2;
  ProfileIter pvVar3;
  bool bVar4;
  long lVar5;
  BrakeProfile *pBVar6;
  BrakeProfile *pBVar7;
  byte bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  bVar8 = 0;
  dVar9 = aMax - aMin;
  dVar12 = aMin + aMin;
  dVar9 = (((this->vf_vf * aMax - this->v0_v0 * aMin) - dVar12 * aMax * this->pd) * 4.0) / dVar9 +
          (((((aMax - (this->a0 + this->a0)) * this->v0 - (aMin - (this->af + this->af)) * this->vf)
             * aMax * aMin + this->a0_a0 * aMin * this->v0) - this->af_af * aMax * this->vf) *
           jMax * 12.0 +
          (this->af_p4 * aMax - this->a0_p4 * aMin) * 3.0 +
          (aMax * -6.0 * this->a0_a0 +
          aMin * 6.0 * this->af_af + (this->a0_p3 - this->af_p3) * 8.0 + aMax * 3.0 * aMin * dVar9)
          * aMax * aMin) / (dVar9 * 3.0 * this->jMax_jMax);
  if (dVar9 >= 0.0) {
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar9 = dVar9 * 0.5;
    dVar11 = ((aMin - (aMax + aMax)) / (jMax + jMax) + this->a0_a0 / ((aMax + aMax) * jMax)) -
             this->v0 / aMax;
    dVar10 = this->vf / aMin + (-this->af_af / (dVar12 * jMax) - (aMax - dVar12) / (jMax + jMax));
    dVar12 = dVar9 / aMax;
    if ((dVar12 < dVar11) && (-dVar9 / aMin < dVar10)) {
      pPVar2 = *profile;
      (pPVar2->t)._M_elems[0] = (aMax - this->a0) / jMax;
      (pPVar2->t)._M_elems[1] = dVar11 - dVar12;
      (pPVar2->t)._M_elems[2] = aMax / jMax;
      (pPVar2->t)._M_elems[3] = 0.0;
      (pPVar2->t)._M_elems[4] = -aMin / jMax;
      (pPVar2->t)._M_elems[5] = dVar9 / aMin + dVar10;
      (pPVar2->t)._M_elems[6] = this->af / jMax + -aMin / jMax;
      bVar4 = Profile::
              check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)4,true>
                        (pPVar2,jMax,vMax,vMin,aMax,aMin);
      if (bVar4) {
        pvVar3 = *profile;
        *profile = pvVar3 + 1;
        dVar1 = (pvVar3->v)._M_elems[0];
        pvVar3[1].a._M_elems[0] = (pvVar3->a)._M_elems[0];
        pvVar3[1].v._M_elems[0] = dVar1;
        pvVar3[1].p._M_elems[0] = (pvVar3->p)._M_elems[0];
        pvVar3[1].af = pvVar3->af;
        dVar1 = pvVar3->vf;
        pvVar3[1].pf = pvVar3->pf;
        pvVar3[1].vf = dVar1;
        pBVar6 = &pvVar3->brake;
        pBVar7 = &pvVar3[1].brake;
        for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
          pBVar7->duration = pBVar6->duration;
          pBVar6 = (BrakeProfile *)((long)pBVar6 + (ulong)bVar8 * -0x10 + 8);
          pBVar7 = (BrakeProfile *)((long)pBVar7 + (ulong)bVar8 * -0x10 + 8);
        }
        pBVar6 = &pvVar3->accel;
        pBVar7 = &pvVar3[1].accel;
        for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
          pBVar7->duration = pBVar6->duration;
          pBVar6 = (BrakeProfile *)((long)pBVar6 + (ulong)bVar8 * -0x10 + 8);
          pBVar7 = (BrakeProfile *)((long)pBVar7 + (ulong)bVar8 * -0x10 + 8);
        }
        if (return_after_found) {
          return;
        }
      }
    }
    if ((-dVar9 / aMax < dVar11) && (dVar9 / aMin < dVar10)) {
      pPVar2 = *profile;
      (pPVar2->t)._M_elems[0] = (aMax - this->a0) / jMax;
      (pPVar2->t)._M_elems[1] = dVar12 + dVar11;
      (pPVar2->t)._M_elems[2] = aMax / jMax;
      (pPVar2->t)._M_elems[3] = 0.0;
      (pPVar2->t)._M_elems[4] = -aMin / jMax;
      (pPVar2->t)._M_elems[5] = dVar10 - dVar9 / aMin;
      (pPVar2->t)._M_elems[6] = this->af / jMax + -aMin / jMax;
      bVar4 = Profile::
              check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)4,true>
                        (pPVar2,jMax,vMax,vMin,aMax,aMin);
      if (bVar4) {
        pvVar3 = *profile;
        *profile = pvVar3 + 1;
        dVar9 = (pvVar3->v)._M_elems[0];
        pvVar3[1].a._M_elems[0] = (pvVar3->a)._M_elems[0];
        pvVar3[1].v._M_elems[0] = dVar9;
        pvVar3[1].p._M_elems[0] = (pvVar3->p)._M_elems[0];
        pvVar3[1].af = pvVar3->af;
        dVar9 = pvVar3->vf;
        pvVar3[1].pf = pvVar3->pf;
        pvVar3[1].vf = dVar9;
        pBVar6 = &pvVar3->brake;
        pBVar7 = &pvVar3[1].brake;
        for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
          pBVar7->duration = pBVar6->duration;
          pBVar6 = (BrakeProfile *)((long)pBVar6 + (ulong)bVar8 * -0x10 + 8);
          pBVar7 = (BrakeProfile *)((long)pBVar7 + (ulong)bVar8 * -0x10 + 8);
        }
        pBVar6 = &pvVar3->accel;
        pBVar7 = &pvVar3[1].accel;
        for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
          pBVar7->duration = pBVar6->duration;
          pBVar6 = (BrakeProfile *)((long)pBVar6 + (ulong)bVar8 * -0x10 + 8);
          pBVar7 = (BrakeProfile *)((long)pBVar7 + (ulong)bVar8 * -0x10 + 8);
        }
      }
    }
  }
  return;
}

Assistant:

void PositionThirdOrderStep1::time_acc0_acc1(ProfileIter& profile, double vMax, double vMin, double aMax, double aMin, double jMax, bool return_after_found) const {
    double h1 = (3*(af_p4*aMax - a0_p4*aMin) + aMax*aMin*(8*(a0_p3 - af_p3) + 3*aMax*aMin*(aMax - aMin) + 6*aMin*af_af - 6*aMax*a0_a0) + 12*jMax*(aMax*aMin*((aMax - 2*a0)*v0 - (aMin - 2*af)*vf) + aMin*a0_a0*v0 - aMax*af_af*vf))/(3*(aMax - aMin)*jMax_jMax) + 4*(aMax*vf_vf - aMin*v0_v0 - 2*aMin*aMax*pd)/(aMax - aMin);

    if (h1 >= 0) {
        h1 = std::sqrt(h1) / 2;
        const double h2 = a0_a0/(2*aMax*jMax) + (aMin - 2*aMax)/(2*jMax) - v0/aMax;
        const double h3 = -af_af/(2*aMin*jMax) - (aMax - 2*aMin)/(2*jMax) + vf/aMin;

        // UDDU: Solution 2
        if (h2 > h1/aMax && h3 > -h1/aMin) {
            profile->t[0] = (-a0 + aMax)/jMax;
            profile->t[1] = h2 - h1/aMax;
            profile->t[2] = aMax/jMax;
            profile->t[3] = 0;
            profile->t[4] = -aMin/jMax;
            profile->t[5] = h3 + h1/aMin;
            profile->t[6] = profile->t[4] + af/jMax;

            if (profile->check<ControlSigns::UDDU, ReachedLimits::ACC0_ACC1, true>(jMax, vMax, vMin, aMax, aMin)) {
                add_profile(profile);
                if (return_after_found) {
                    return;
                }
            }
        }

        // UDDU: Solution 1
        if (h2 > -h1/aMax && h3 > h1/aMin) {
            profile->t[0] = (-a0 + aMax)/jMax;
            profile->t[1] = h2 + h1/aMax;
            profile->t[2] = aMax/jMax;
            profile->t[3] = 0;
            profile->t[4] = -aMin/jMax;
            profile->t[5] = h3 - h1/aMin;
            profile->t[6] = profile->t[4] + af/jMax;

            if (profile->check<ControlSigns::UDDU, ReachedLimits::ACC0_ACC1, true>(jMax, vMax, vMin, aMax, aMin)) {
                add_profile(profile);
            }
        }
    }
}